

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

bool absl::lts_20240722::container_internal::
     AreNodesFromSameContainer<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::Descriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>,256,false>>>
               (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *node_a,btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                        *node_b)

{
  bool bVar1;
  
  bVar1 = true;
  if (node_b != (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                 *)0x0 &&
      node_a != (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                 *)0x0) {
    while (bVar1 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                   ::is_root(node_a), !bVar1) {
      if (((ulong)node_a & 7) != 0) goto LAB_001d6e6c;
      node_a = *(btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                 **)node_a;
    }
    while (bVar1 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                   ::is_root(node_b), !bVar1) {
      if (((ulong)node_b & 7) != 0) {
LAB_001d6e6c:
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                      ,0x1fe,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::Descriptor *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::Descriptor *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::Descriptor *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::Descriptor *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 0UL, Char = const char]"
                     );
      }
      node_b = *(btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                 **)node_b;
    }
    bVar1 = node_a == node_b;
  }
  return bVar1;
}

Assistant:

bool AreNodesFromSameContainer(const Node *node_a, const Node *node_b) {
  // If either node is null, then give up on checking whether they're from the
  // same container. (If exactly one is null, then we'll trigger the
  // default-constructed assert in Equals.)
  if (node_a == nullptr || node_b == nullptr) return true;
  while (!node_a->is_root()) node_a = node_a->parent();
  while (!node_b->is_root()) node_b = node_b->parent();
  return node_a == node_b;
}